

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

void al_set_target_bitmap(ALLEGRO_BITMAP *bitmap)

{
  long lVar1;
  ALLEGRO_DISPLAY *pAVar2;
  _func_void_ALLEGRO_DISPLAY_ptr *p_Var3;
  _func__Bool_ALLEGRO_DISPLAY_ptr *p_Var4;
  _func_void_ALLEGRO_DISPLAY_ptr_ALLEGRO_BITMAP_ptr *p_Var5;
  uint uVar6;
  ALLEGRO_BITMAP *pAVar7;
  long *plVar8;
  ALLEGRO_DISPLAY *pAVar9;
  ALLEGRO_SHADER *shader;
  ALLEGRO_SHADER *pAVar10;
  bool bVar11;
  
  if (bitmap == (ALLEGRO_BITMAP *)0x0) {
    bVar11 = false;
  }
  else {
    uVar6 = al_get_bitmap_flags(bitmap);
    bVar11 = (uVar6 & 1) == 0;
    pAVar7 = bitmap->parent;
    if (bitmap->parent == (ALLEGRO_BITMAP *)0x0) {
      pAVar7 = bitmap;
    }
    pAVar7->dirty = true;
  }
  plVar8 = (long *)__tls_get_addr(&PTR_001d9500);
  if (*plVar8 == 0) {
    *plVar8 = (long)(plVar8 + 1);
    initialize_tls_values((thread_local_state *)(plVar8 + 1));
  }
  lVar1 = *plVar8;
  if (lVar1 != 0) {
    pAVar2 = *(ALLEGRO_DISPLAY **)(lVar1 + 0xd0);
    if (*(long *)(lVar1 + 0xd8) == 0) {
      pAVar10 = (ALLEGRO_SHADER *)0x0;
    }
    else {
      pAVar10 = *(ALLEGRO_SHADER **)(*(long *)(lVar1 + 0xd8) + 0x170);
    }
    pAVar9 = pAVar2;
    if (bitmap == (ALLEGRO_BITMAP *)0x0) {
      pAVar9 = (ALLEGRO_DISPLAY *)0x0;
    }
    if (bVar11) {
      pAVar9 = _al_get_bitmap_display(bitmap);
      shader = bitmap->shader;
    }
    else {
      shader = (ALLEGRO_SHADER *)0x0;
    }
    if ((pAVar10 != (ALLEGRO_SHADER *)0x0) && (pAVar2 != pAVar9 || pAVar10 != shader)) {
      (*pAVar10->vt->unuse_shader)(pAVar10,pAVar2);
    }
    if (pAVar2 != pAVar9) {
      if (((pAVar2 != (ALLEGRO_DISPLAY *)0x0) && (pAVar2->vt != (ALLEGRO_DISPLAY_INTERFACE *)0x0))
         && (p_Var3 = pAVar2->vt->unset_current_display,
            p_Var3 != (_func_void_ALLEGRO_DISPLAY_ptr *)0x0)) {
        (*p_Var3)(pAVar2);
      }
      *(ALLEGRO_DISPLAY **)(lVar1 + 0xd0) = pAVar9;
      if (((pAVar9 != (ALLEGRO_DISPLAY *)0x0) && (pAVar9->vt != (ALLEGRO_DISPLAY_INTERFACE *)0x0))
         && (p_Var4 = pAVar9->vt->set_current_display,
            p_Var4 != (_func__Bool_ALLEGRO_DISPLAY_ptr *)0x0)) {
        (*p_Var4)(pAVar9);
      }
    }
    *(ALLEGRO_BITMAP **)(lVar1 + 0xd8) = bitmap;
    if ((((bool)(bVar11 & pAVar9 != (ALLEGRO_DISPLAY *)0x0)) &&
        (pAVar9->vt != (ALLEGRO_DISPLAY_INTERFACE *)0x0)) &&
       (p_Var5 = pAVar9->vt->set_target_bitmap,
       p_Var5 != (_func_void_ALLEGRO_DISPLAY_ptr_ALLEGRO_BITMAP_ptr *)0x0)) {
      (*p_Var5)(pAVar9,bitmap);
      if ((pAVar2 != pAVar9 || pAVar10 != shader) || shader == (ALLEGRO_SHADER *)0x0) {
        al_use_shader(shader);
      }
      (*pAVar9->vt->update_transformation)(pAVar9,bitmap);
      return;
    }
  }
  return;
}

Assistant:

void al_set_target_bitmap(ALLEGRO_BITMAP *bitmap)
{
   thread_local_state *tls;
   ALLEGRO_DISPLAY *old_display;
   ALLEGRO_DISPLAY *new_display;
   ALLEGRO_SHADER *old_shader;
   ALLEGRO_SHADER *new_shader;
   bool same_shader;
   int bitmap_flags = bitmap ? al_get_bitmap_flags(bitmap) : 0;

   ASSERT(!al_is_bitmap_drawing_held());

   if (bitmap) {
      if (bitmap->parent) {
         bitmap->parent->dirty = true;
      }
      else {
         bitmap->dirty = true;
      }
   }

   if ((tls = tls_get()) == NULL)
      return;

   old_display = tls->current_display;

   if (tls->target_bitmap)
      old_shader = tls->target_bitmap->shader;
   else
      old_shader = NULL;

   if (bitmap == NULL) {
      /* Explicitly releasing the current rendering context. */
      new_display = NULL;
      new_shader = NULL;
   }
   else if (bitmap_flags & ALLEGRO_MEMORY_BITMAP) {
      /* Setting a memory bitmap doesn't change the rendering context. */
      new_display = old_display;
      new_shader = NULL;
   }
   else {
      new_display = _al_get_bitmap_display(bitmap);
      new_shader = bitmap->shader;
   }

   same_shader = (old_shader == new_shader && old_display == new_display);

   /* Unset the old shader if necessary. */
   if (old_shader && !same_shader) {
      old_shader->vt->unuse_shader(old_shader, old_display);
   }

   /* Change the rendering context if necessary. */
   if (old_display != new_display) {
      if (old_display &&
            old_display->vt &&
            old_display->vt->unset_current_display) {
         old_display->vt->unset_current_display(old_display);
      }

      tls->current_display = new_display;

      if (new_display &&
            new_display->vt &&
            new_display->vt->set_current_display) {
         new_display->vt->set_current_display(new_display);
      }
   }

   /* Change the target bitmap itself. */
   tls->target_bitmap = bitmap;

   if (bitmap &&
         !(bitmap_flags & ALLEGRO_MEMORY_BITMAP) &&
         new_display &&
         new_display->vt &&
         new_display->vt->set_target_bitmap)
   {
      new_display->vt->set_target_bitmap(new_display, bitmap);

      /* Set the new shader if necessary.  This should done before the
       * update_transformation call, which will also update the shader's
       * al_projview_matrix variable.
       */
      if (!same_shader || !new_shader) {
         al_use_shader(new_shader);
      }

      new_display->vt->update_transformation(new_display, bitmap);
   }
}